

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdnslookup_p.cpp
# Opt level: O1

void QDnsLookupRunnable::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long in_FS_OFFSET;
  void *local_28;
  void *pvStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_id == 0 && _c == InvokeMetaMethod) {
    pvStack_20 = _a[1];
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_28);
  }
  if (((_c == IndexOfMethod) && (*_a[1] == finished)) && (*(long *)((long)_a[1] + 8) == 0)) {
    *(undefined4 *)*_a = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDnsLookupRunnable::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDnsLookupRunnable *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished((*reinterpret_cast< std::add_pointer_t<QDnsLookupReply>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDnsLookupRunnable::*)(const QDnsLookupReply & )>(_a, &QDnsLookupRunnable::finished, 0))
            return;
    }
}